

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool mi_arena_try_purge(mi_arena_t *arena,mi_msecs_t now,_Bool force)

{
  size_t sVar1;
  bool bVar2;
  _Bool _Var3;
  size_t purge_00;
  mi_bitmap_index_t bitmap_fields;
  long lVar4;
  mi_msecs_t mVar5;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  bool bVar6;
  mi_msecs_t expected;
  long delay;
  mi_bitmap_index_t bitmap_index;
  size_t bitlen;
  size_t bitidx;
  size_t purge;
  size_t i;
  _Bool full_purge;
  _Bool any_purged;
  mi_msecs_t expire;
  size_t in_stack_ffffffffffffff38;
  mi_stat_counter_t *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  size_t in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  long lVar7;
  mi_arena_t *in_stack_ffffffffffffff80;
  mi_bitmap_index_t in_stack_ffffffffffffff88;
  mi_bitmap_t bitmap;
  mi_bitmap_t bitmap_00;
  ulong local_50;
  ulong local_48;
  _Bool local_1;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    sVar1 = *(size_t *)(in_RDI + 0x90);
    if (((in_DL & 1) == 0) && ((sVar1 == 0 || (in_RSI < (long)sVar1)))) {
      local_1 = false;
    }
    else {
      LOCK();
      purge_00 = *(size_t *)(in_RDI + 0x90);
      if (sVar1 == purge_00) {
        *(size_t *)(in_RDI + 0x90) = 0;
        purge_00 = sVar1;
      }
      UNLOCK();
      _mi_stat_counter_increase(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_1 = false;
      bVar2 = true;
      for (local_48 = 0; local_48 < *(ulong *)(in_RDI + 0x30); local_48 = local_48 + 1) {
        local_50 = *(ulong *)(*(long *)(in_RDI + 0xa8) + local_48 * 8);
        if (local_50 != 0) {
          for (bitmap_00 = (mi_bitmap_t)0x0; bitmap_00 < (mi_bitmap_t)0x40;
              bitmap_00 = (mi_bitmap_t)((long)bitmap + 1 + (long)bitmap_00)) {
            bitmap = (mi_bitmap_t)0x0;
            while( true ) {
              bVar6 = false;
              if ((ulong)((long)bitmap_00 + (long)bitmap) < 0x40) {
                bVar6 = (local_50 & 1L << ((char)bitmap_00 + (char)bitmap & 0x3fU)) != 0;
              }
              if (!bVar6) break;
              bitmap = (mi_bitmap_t)((long)bitmap + 1);
            }
            bitmap_fields =
                 mi_bitmap_index_create((size_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
            ;
            while ((bitmap != (mi_bitmap_t)0x0 &&
                   (_Var3 = _mi_bitmap_try_claim
                                      (bitmap,bitmap_fields,in_stack_ffffffffffffff88,
                                       (mi_bitmap_index_t)in_stack_ffffffffffffff80), !_Var3))) {
              bitmap = (mi_bitmap_t)((long)bitmap + -1);
            }
            if (bitmap != (mi_bitmap_t)0x0) {
              local_50 = *(mi_bitmap_index_t *)(*(long *)(in_RDI + 0xa8) + local_48 * 8);
              in_stack_ffffffffffffff88 = local_50;
              _Var3 = mi_arena_purge_range
                                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                 in_stack_ffffffffffffff70,
                                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                                 purge_00);
              if (!_Var3) {
                bVar2 = false;
              }
              local_1 = true;
              _mi_bitmap_unclaim(bitmap_00,(size_t)bitmap,bitmap_fields,in_stack_ffffffffffffff88);
            }
          }
        }
      }
      if (!bVar2) {
        lVar4 = mi_arena_purge_delay();
        lVar7 = 0;
        mVar5 = _mi_clock_now();
        LOCK();
        if (lVar7 == *(long *)(in_RDI + 0x90)) {
          *(long *)(in_RDI + 0x90) = mVar5 + lVar4;
        }
        UNLOCK();
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool mi_arena_try_purge(mi_arena_t* arena, mi_msecs_t now, bool force)
{
  // check pre-conditions
  if (arena->memid.is_pinned) return false;
   
  // expired yet?
  mi_msecs_t expire = mi_atomic_loadi64_relaxed(&arena->purge_expire);
  if (!force && (expire == 0 || expire > now)) return false;

  // reset expire (if not already set concurrently)
  mi_atomic_casi64_strong_acq_rel(&arena->purge_expire, &expire, (mi_msecs_t)0);
  _mi_stat_counter_increase(&_mi_stats_main.arena_purges, 1);

  // potential purges scheduled, walk through the bitmap
  bool any_purged = false;
  bool full_purge = true;
  for (size_t i = 0; i < arena->field_count; i++) {
    size_t purge = mi_atomic_load_relaxed(&arena->blocks_purge[i]);
    if (purge != 0) {
      size_t bitidx = 0;
      while (bitidx < MI_BITMAP_FIELD_BITS) {
        // find consecutive range of ones in the purge mask
        size_t bitlen = 0;
        while (bitidx + bitlen < MI_BITMAP_FIELD_BITS && (purge & ((size_t)1 << (bitidx + bitlen))) != 0) {
          bitlen++;
        }
        // temporarily claim the purge range as "in-use" to be thread-safe with allocation
        // try to claim the longest range of corresponding in_use bits
        const mi_bitmap_index_t bitmap_index = mi_bitmap_index_create(i, bitidx);
        while( bitlen > 0 ) {
          if (_mi_bitmap_try_claim(arena->blocks_inuse, arena->field_count, bitlen, bitmap_index)) {
            break;
          }
          bitlen--;
        }
        // actual claimed bits at `in_use`
        if (bitlen > 0) {
          // read purge again now that we have the in_use bits
          purge = mi_atomic_load_acquire(&arena->blocks_purge[i]);
          if (!mi_arena_purge_range(arena, i, bitidx, bitlen, purge)) {
            full_purge = false;
          }
          any_purged = true;
          // release the claimed `in_use` bits again
          _mi_bitmap_unclaim(arena->blocks_inuse, arena->field_count, bitlen, bitmap_index);
        }
        bitidx += (bitlen+1);  // +1 to skip the zero (or end)
      } // while bitidx
    } // purge != 0
  }
  // if not fully purged, make sure to purge again in the future
  if (!full_purge) {
    const long delay = mi_arena_purge_delay();
    mi_msecs_t expected = 0;
    mi_atomic_casi64_strong_acq_rel(&arena->purge_expire,&expected,_mi_clock_now() + delay);
  }
  return any_purged;
}